

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator * __thiscall
QMultiHash<int,_int>::erase
          (iterator *__return_storage_ptr__,QMultiHash<int,_int> *this,const_iterator it)

{
  Span *pSVar1;
  Chain *pCVar2;
  MultiNodeChain<int> *pMVar3;
  Span *pSVar4;
  Chain **ppCVar5;
  Data *pDVar6;
  ulong uVar7;
  long lVar8;
  undefined1 *puVar9;
  uchar *puVar10;
  uint uVar11;
  long in_FS_OFFSET;
  Bucket bucket;
  iterator local_48;
  long local_30;
  ulong uVar12;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  detach(&local_48,this,it);
  ppCVar5 = local_48.e;
  __return_storage_ptr__->e = local_48.e;
  (__return_storage_ptr__->i).d = local_48.i.d;
  (__return_storage_ptr__->i).bucket = local_48.i.bucket;
  pCVar2 = *local_48.e;
  pMVar3 = pCVar2->next;
  *local_48.e = pMVar3;
  if (pCVar2 != (Chain *)0x0) {
    operator_delete(pCVar2,0x10);
  }
  if (pMVar3 != (MultiNodeChain<int> *)0x0) goto LAB_004d3631;
  uVar12 = (__return_storage_ptr__->i).bucket;
  pSVar4 = ((__return_storage_ptr__->i).d)->spans;
  uVar7 = uVar12 >> 7;
  pSVar1 = pSVar4 + uVar7;
  uVar11 = (uint)uVar12 & 0x7f;
  uVar12 = (ulong)uVar11;
  if (ppCVar5 == (Chain **)(pSVar4[uVar7].entries[pSVar1->offsets[uVar12]].storage.data + 8)) {
    bucket.index._0_4_ = uVar11;
    bucket.span = pSVar1;
    bucket.index._4_4_ = 0;
    QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::erase(this->d,bucket);
    pDVar6 = this->d;
    pSVar4 = pDVar6->spans;
    lVar8 = (long)pSVar1 - (long)pSVar4 >> 4;
    puVar9 = (undefined1 *)(lVar8 * 0x1c71c71c71c71c80 | uVar12);
    if ((puVar9 == (undefined1 *)(pDVar6->numBuckets - 1)) || (pSVar1->offsets[uVar12] == 0xff)) {
      do {
        local_48.i.bucket = local_48.i.bucket + 1;
        if ((undefined1 *)(local_48.i.d)->numBuckets == (undefined1 *)local_48.i.bucket)
        goto LAB_004d35cf;
      } while ((local_48.i.d)->spans[local_48.i.bucket >> 7].offsets[(uint)local_48.i.bucket & 0x7f]
               == 0xff);
      goto LAB_004d35d7;
    }
    if (pDVar6 != (Data *)0x0) {
      uVar7 = lVar8 * -0x71c71c71c71c71c7 & 0x1ffffffffffffff;
      pSVar1 = pSVar4 + uVar7;
      puVar10 = pSVar4[uVar7].offsets + uVar12;
      goto LAB_004d3611;
    }
LAB_004d3624:
    puVar10 = (uchar *)0x0;
  }
  else {
    do {
      local_48.i.bucket = local_48.i.bucket + 1;
      if ((undefined1 *)(local_48.i.d)->numBuckets == (undefined1 *)local_48.i.bucket)
      goto LAB_004d35cf;
    } while ((local_48.i.d)->spans[local_48.i.bucket >> 7].offsets[(uint)local_48.i.bucket & 0x7f]
             == 0xff);
LAB_004d35d7:
    pDVar6 = local_48.i.d;
    puVar9 = (undefined1 *)local_48.i.bucket;
    if (local_48.i.d == (Data *)0x0) goto LAB_004d3624;
    pSVar1 = (local_48.i.d)->spans + (local_48.i.bucket >> 7);
    puVar10 = (local_48.i.d)->spans[local_48.i.bucket >> 7].offsets +
              ((uint)local_48.i.bucket & 0x7f);
LAB_004d3611:
    puVar10 = pSVar1->entries[*puVar10].storage.data + 8;
  }
  (__return_storage_ptr__->i).d = pDVar6;
  (__return_storage_ptr__->i).bucket = (size_t)puVar9;
  __return_storage_ptr__->e = (Chain **)puVar10;
LAB_004d3631:
  this->m_size = this->m_size + -1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
LAB_004d35cf:
  local_48.i.d = (Data *)0x0;
  local_48.i.bucket = 0;
  goto LAB_004d35d7;
}

Assistant:

iterator erase(const_iterator it)
    {
        Q_ASSERT(d);
        iterator iter = detach(it);
        iterator i = iter;
        Chain *e = *i.e;
        Chain *next = e->next;
        *i.e = next;
        delete e;
        if (!next) {
            if (i.e == &i.i.node()->value) {
                // last remaining entry, erase
                typename Data::Bucket bucket(i.i);
                d->erase(bucket);
                if (bucket.toBucketIndex(d) == d->numBuckets - 1 || bucket.isUnused())
                    i = iterator(++iter.i);
                else // 'i' currently has a nullptr chain. So, we must recreate it
                    i = iterator(bucket.toIterator(d));
            } else {
                i = iterator(++iter.i);
            }
        }
        --m_size;
        Q_ASSERT(m_size >= 0);
        return i;
    }